

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void SkipLine(ConfigScanner *sc)

{
  char cVar1;
  size_t sVar2;
  long in_RDI;
  size_t step;
  
  if (in_RDI != 0) {
    while( true ) {
      sVar2 = GetUTF8Length(**(char **)(in_RDI + 0x18));
      cVar1 = **(char **)(in_RDI + 0x18);
      if (cVar1 == '\0') break;
      if (cVar1 == '\n') {
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
        return;
      }
      if (cVar1 == '\r') {
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
        if (**(char **)(in_RDI + 0x18) != '\n') {
          return;
        }
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 1;
        return;
      }
      if (sVar2 == 0) {
        return;
      }
      *(size_t *)(in_RDI + 0x18) = sVar2 + *(long *)(in_RDI + 0x18);
    }
  }
  return;
}

Assistant:

void SkipLine(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	while (true)
	{
		size_t step = GetUTF8Length(*sc->ptr);
		switch (*sc->ptr)
		{
		case '\0':
			return;
		case '\n':
			sc->ptr++;
			return;
		case '\r':
			sc->ptr++;
			if (*sc->ptr == '\n')
			{
				sc->ptr++;
			}
			return;
		default:
			if (step == 0)
			{
				return;
			}
			sc->ptr += step;
		}
	}
	return;
}